

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O1

int Abc_NtkHaigResetReprs(Hop_Man_t *p)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  long lVar4;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *pHVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)pVVar7->pArray[lVar4];
      puVar2 = (undefined8 *)*puVar1;
      if ((puVar2 != (undefined8 *)0x0) && ((undefined8 *)*puVar2 == puVar1)) {
        *puVar2 = puVar2;
      }
      if ((undefined8 *)*puVar1 == puVar1) {
        *puVar1 = 0;
      }
      lVar4 = lVar4 + 1;
      pVVar7 = p->vObjs;
    } while (lVar4 < pVVar7->nSize);
  }
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      plVar3 = (long *)(&((Hop_Obj_t *)pVVar7->pArray)->field_0)[lVar4].pData;
      if (*plVar3 != 0) {
        pHVar5 = Hop_ObjRepr((Hop_Obj_t *)pVVar7->pArray);
        (pHVar5->field_0).pData = pHVar5;
        *plVar3 = (long)pHVar5;
      }
      lVar4 = lVar4 + 1;
      pVVar7 = p->vObjs;
    } while (lVar4 < pVVar7->nSize);
  }
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar4 = 0;
    do {
      pHVar5 = (Hop_Obj_t *)(&((Hop_Obj_t *)pVVar7->pArray)->field_0)[lVar4].pData;
      if ((pHVar5->field_0).pData != (void *)0x0) {
        pHVar6 = Hop_ObjRepr((Hop_Obj_t *)pVVar7->pArray);
        if (pHVar5->Id < pHVar6->Id) {
          (pHVar6->field_0).pData = pHVar5;
          pHVar6 = pHVar5;
        }
        (pHVar5->field_0).pData = pHVar6;
      }
      lVar4 = lVar4 + 1;
      pVVar7 = p->vObjs;
    } while (lVar4 < pVVar7->nSize);
  }
  pVVar7 = p->vObjs;
  if (pVVar7->nSize < 1) {
    iVar8 = 0;
  }
  else {
    lVar4 = 0;
    iVar8 = 0;
    do {
      pHVar5 = (Hop_Obj_t *)pVVar7->pArray[lVar4];
      pHVar6 = (Hop_Obj_t *)(pHVar5->field_0).pData;
      if (pHVar6 != (Hop_Obj_t *)0x0) {
        if (pHVar6 != pHVar5) {
          iVar8 = (iVar8 + 1) - (uint)(*(uint *)&pHVar5->field_0x20 < 0x40);
        }
        pHVar6 = Hop_ObjRepr(pHVar6);
        if ((Hop_Obj_t *)(pHVar5->field_0).pData != pHVar6) {
          __assert_fail("pObj->pData == pRepr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                        ,0x202,"int Abc_NtkHaigResetReprs(Hop_Man_t *)");
        }
        if (pHVar5->Id < pHVar6->Id) {
          __assert_fail("pRepr->Id <= pObj->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                        ,0x203,"int Abc_NtkHaigResetReprs(Hop_Man_t *)");
        }
      }
      lVar4 = lVar4 + 1;
      pVVar7 = p->vObjs;
    } while (lVar4 < pVVar7->nSize);
  }
  return iVar8;
}

Assistant:

int Abc_NtkHaigResetReprs( Hop_Man_t * p )
{
    Hop_Obj_t * pObj, * pRepr;
    int i, nClasses, nMembers, nFanouts, nNormals;
    // clear self-classes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        // fix the strange situation of double-loop
        pRepr = (Hop_Obj_t *)pObj->pData;
        if ( pRepr && pRepr->pData == pObj )
            pRepr->pData = pRepr;
        // remove self-loops
        if ( pObj->pData == pObj )
            pObj->pData = NULL;
    }
    // set representatives
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        // get representative of the node
        pRepr = Hop_ObjRepr( pObj );
        pRepr->pData = pRepr;
        // set the representative
        pObj->pData = pRepr;
    }
    // make each class point to the smallest topological order
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        pRepr = Hop_ObjRepr( pObj );
        if ( pRepr->Id > pObj->Id )
        {
            pRepr->pData = pObj;
            pObj->pData = pObj;
        }
        else
            pObj->pData = pRepr;
    }
    // count classes, members, and fanouts - and verify
    nMembers = nClasses = nFanouts = nNormals = 0;
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        // count members
        nMembers++;
        // count the classes and fanouts
        if ( pObj->pData == pObj )
            nClasses++;
        else if ( Hop_ObjRefs(pObj) > 0 )
            nFanouts++;
        else
            nNormals++;
        // compare representatives
        pRepr = Hop_ObjRepr( pObj );
        assert( pObj->pData == pRepr );
        assert( pRepr->Id <= pObj->Id );
    }
//    printf( "Nodes = %7d.  Member = %7d.  Classes = %6d.  Fanouts = %6d.  Normals = %6d.\n", 
//        Hop_ManNodeNum(p), nMembers, nClasses, nFanouts, nNormals );
    return nFanouts;
}